

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O0

void GPU_PrimitiveBatchV(GPU_Image *image,GPU_Target *target,GPU_PrimitiveEnum primitive_type,
                        unsigned_short num_vertices,void *values,uint num_indices,
                        unsigned_short *indices,GPU_BatchFlagEnum flags)

{
  uint num_indices_local;
  void *values_local;
  unsigned_short num_vertices_local;
  GPU_PrimitiveEnum primitive_type_local;
  GPU_Target *target_local;
  GPU_Image *image_local;
  
  if (_gpu_current_renderer == (GPU_Renderer *)0x0) {
    GPU_PushErrorCode("GPU_PrimitiveBatchV",GPU_ERROR_USER_ERROR,"%s","NULL renderer");
  }
  else {
    if (((_gpu_current_renderer->current_context_target == (GPU_Target *)0x0) &&
        (target != (GPU_Target *)0x0)) && (target->context != (GPU_Context *)0x0)) {
      GPU_MakeCurrent(target,target->context->windowID);
    }
    if (_gpu_current_renderer->current_context_target == (GPU_Target *)0x0) {
      GPU_PushErrorCode("GPU_PrimitiveBatchV",GPU_ERROR_USER_ERROR,"%s","NULL context");
    }
    else if (target == (GPU_Target *)0x0) {
      GPU_PushErrorCode("GPU_PrimitiveBatchV",GPU_ERROR_NULL_ARGUMENT,"%s","target");
    }
    else if (num_vertices != 0) {
      (*_gpu_current_renderer->impl->PrimitiveBatchV)
                (_gpu_current_renderer,image,target,primitive_type,num_vertices,values,num_indices,
                 indices,flags);
    }
  }
  return;
}

Assistant:

void GPU_PrimitiveBatchV(GPU_Image* image, GPU_Target* target, GPU_PrimitiveEnum primitive_type, unsigned short num_vertices, void* values, unsigned int num_indices, unsigned short* indices, GPU_BatchFlagEnum flags)
{
    if(!CHECK_RENDERER)
        RETURN_ERROR(GPU_ERROR_USER_ERROR, "NULL renderer");
    MAKE_CURRENT_IF_NONE(target);
    if(!CHECK_CONTEXT)
        RETURN_ERROR(GPU_ERROR_USER_ERROR, "NULL context");

    if(target == NULL)
        RETURN_ERROR(GPU_ERROR_NULL_ARGUMENT, "target");

    if(num_vertices == 0)
        return;


    _gpu_current_renderer->impl->PrimitiveBatchV(_gpu_current_renderer, image, target, primitive_type, num_vertices, values, num_indices, indices, flags);
}